

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cc
# Opt level: O0

void __thiscall
kratos::SystemVerilogCodeGen::block_code
          (SystemVerilogCodeGen *this,string *syntax_name,StmtBlock *stmt)

{
  char cVar1;
  uint32_t uVar2;
  int iVar3;
  ulong uVar4;
  basic_ostream<char,_std::char_traits<char>_> *pbVar5;
  ostream *poVar6;
  uint64_t uVar7;
  undefined4 extraout_var;
  string local_b8;
  string_view local_98;
  ulong local_88;
  uint64_t i;
  string local_50;
  string_view local_30;
  StmtBlock *local_20;
  StmtBlock *stmt_local;
  string *syntax_name_local;
  SystemVerilogCodeGen *this_local;
  
  local_20 = stmt;
  stmt_local = (StmtBlock *)syntax_name;
  syntax_name_local = (string *)this;
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    local_30 = indent(this);
    pbVar5 = std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)
                             &(this->stream_).super_stringstream.field_0x10,local_30);
    poVar6 = std::operator<<(pbVar5,"// ");
    strip_newline(&local_50,&(local_20->super_Stmt).super_IRNode.comment);
    poVar6 = std::operator<<(poVar6,(string *)&local_50);
    cVar1 = Stream::endl(&this->stream_);
    std::operator<<(poVar6,cVar1);
    std::__cxx11::string::~string((string *)&local_50);
  }
  if ((this->generator_->debug & 1U) != 0) {
    uVar2 = Stream::line_no(&this->stream_);
    (local_20->super_Stmt).super_IRNode.verilog_ln = uVar2;
  }
  poVar6 = std::operator<<((ostream *)&(this->stream_).super_stringstream.field_0x10,
                           (string *)stmt_local);
  poVar6 = std::operator<<(poVar6," begin");
  block_label_abi_cxx11_((string *)&i,this,local_20);
  poVar6 = std::operator<<(poVar6,(string *)&i);
  cVar1 = Stream::endl(&this->stream_);
  std::operator<<(poVar6,cVar1);
  std::__cxx11::string::~string((string *)&i);
  this->indent_ = this->indent_ + 1;
  local_88 = 0;
  while( true ) {
    uVar4 = local_88;
    uVar7 = StmtBlock::size(local_20);
    if (uVar7 <= uVar4) break;
    iVar3 = (*(local_20->super_Stmt).super_IRNode._vptr_IRNode[2])(local_20,local_88);
    (**this->_vptr_SystemVerilogCodeGen)(this,CONCAT44(extraout_var,iVar3));
    local_88 = local_88 + 1;
  }
  this->indent_ = this->indent_ - 1;
  local_98 = indent(this);
  pbVar5 = std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)
                           &(this->stream_).super_stringstream.field_0x10,local_98);
  poVar6 = std::operator<<(pbVar5,"end");
  block_label_abi_cxx11_(&local_b8,this,local_20);
  poVar6 = std::operator<<(poVar6,(string *)&local_b8);
  cVar1 = Stream::endl(&this->stream_);
  std::operator<<(poVar6,cVar1);
  std::__cxx11::string::~string((string *)&local_b8);
  return;
}

Assistant:

void SystemVerilogCodeGen::block_code(const std::string& syntax_name, kratos::StmtBlock* stmt) {
    // comment
    if (!stmt->comment.empty()) {
        stream_ << indent() << "// " << strip_newline(stmt->comment) << stream_.endl();
    }
    if (generator_->debug) {
        stmt->verilog_ln = stream_.line_no();
    }
    stream_ << syntax_name << " begin" << block_label(stmt) << stream_.endl();
    indent_++;

    for (uint64_t i = 0; i < stmt->size(); i++) {
        dispatch_node(stmt->get_child(i));
    }

    indent_--;
    stream_ << indent() << "end" << block_label(stmt) << stream_.endl();
}